

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Game::assignMonsters(Game *this)

{
  pointer this_00;
  bool bVar1;
  reference ppPVar2;
  string *psVar3;
  vector<MonsterCards,_std::allocator<MonsterCards>_> *this_01;
  const_reference p2;
  reference ppPVar4;
  ostream *poVar5;
  bool local_159;
  int local_14c;
  undefined1 local_148 [4];
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68 [3];
  int local_4c;
  undefined1 local_48 [4];
  int option;
  vector<int,_std::allocator<int>_> assigned;
  Player *player;
  iterator __end1;
  iterator __begin1;
  vector<Player_*,_std::allocator<Player_*>_> *__range1;
  Game *this_local;
  
  __end1 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(&players);
  player = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(&players);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                *)&player);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
              operator*(&__end1);
    assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*ppPVar2;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
    local_4c = -1;
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    while( true ) {
      local_159 = true;
      if ((-1 < local_4c) && (local_159 = true, local_4c < 6)) {
        local_70._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_48);
        local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)local_48);
        local_68[0] = std::
                      find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                (local_70,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           )local_78,&local_4c);
        local_80._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_48);
        local_159 = __gnu_cxx::operator!=(local_68,&local_80);
      }
      if (local_159 == false) break;
      local_4c = -1;
      poVar5 = std::operator<<((ostream *)&std::cout,"Player :");
      psVar3 = Player::getPlayerName_abi_cxx11_
                         ((Player *)
                          assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      poVar5 = std::operator<<(poVar5,(string *)psVar3);
      poVar5 = std::operator<<(poVar5," , please select an UNASSIGNED Monster card (index)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = ::operator<<((ostream *)&std::cout,&this->deckOfMonsterCards);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::istream::operator>>((istream *)&std::cin,&local_4c);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_48,&local_4c);
    this_00 = assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
    this_01 = DeckOfMonsterCards::getDeck(&this->deckOfMonsterCards);
    p2 = std::vector<MonsterCards,_std::allocator<MonsterCards>_>::operator[]
                   (this_01,(long)local_4c);
    MonsterCards::MonsterCards((MonsterCards *)local_148,p2);
    Player::assignMonster((Player *)this_00,(MonsterCards *)local_148);
    MonsterCards::~MonsterCards((MonsterCards *)local_148);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
    __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
    operator++(&__end1);
  }
  for (local_14c = 0; local_14c < this->numberOfPlayers; local_14c = local_14c + 1) {
    ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::operator[](&players,(long)local_14c)
    ;
    poVar5 = ::operator<<((ostream *)&std::cout,*ppPVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Game::assignMonsters(){
    for(auto player : players){
        vector<int> assigned;
        int option = -1;
        cout << endl;

        while(option < 0 || option >5 || find(assigned.begin(), assigned.end(),option)!=assigned.end()){
            option = -1;
            cout<< "Player :" << player->getPlayerName() << " , please select an UNASSIGNED Monster card (index)" << endl;
            cout << deckOfMonsterCards << endl;
            cin >> option;
        }
        assigned.push_back(option);
        player->assignMonster(deckOfMonsterCards.getDeck()[option]);
    }

    for (int i=0; i< numberOfPlayers; i++){
        cout << players[i] << endl;
    }
}